

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void array_resize(_array *x,int n)

{
  int iVar1;
  int iVar2;
  t_template *template_00;
  char *pcVar3;
  t_word *wp;
  t_word *ptStack_38;
  int i;
  char *cp;
  t_template *template;
  char *tmp;
  int oldn;
  int elemsize;
  int n_local;
  _array *x_local;
  
  template_00 = template_findbyname(x->a_templatesym);
  oldn = n;
  if (n < 1) {
    oldn = 1;
  }
  iVar1 = x->a_n;
  iVar2 = template_00->t_n * 8;
  pcVar3 = (char *)resizebytes(x->a_vec,(long)(iVar1 * iVar2),(long)(oldn * iVar2));
  if (pcVar3 != (char *)0x0) {
    x->a_vec = pcVar3;
    x->a_n = oldn;
    if (iVar1 < oldn) {
      ptStack_38 = (t_word *)(x->a_vec + iVar2 * iVar1);
      wp._4_4_ = oldn - iVar1;
      while (wp._4_4_ != 0) {
        word_init(ptStack_38,template_00,&x->a_gp);
        ptStack_38 = (t_word *)((long)ptStack_38 + (long)iVar2);
        wp._4_4_ = wp._4_4_ + -1;
      }
    }
    glist_valid = glist_valid + 1;
    x->a_valid = glist_valid;
  }
  return;
}

Assistant:

void array_resize(t_array *x, int n)
{
    int elemsize, oldn;
    char *tmp;
    t_template *template = template_findbyname(x->a_templatesym);
    if (n < 1)
        n = 1;
    oldn = x->a_n;
    elemsize = sizeof(t_word) * template->t_n;

    tmp = (char *)resizebytes(x->a_vec, oldn * elemsize, n * elemsize);
    if (!tmp)
        return;
    x->a_vec = tmp;
    x->a_n = n;
    if (n > oldn)
    {
        char *cp = x->a_vec + elemsize * oldn;
        int i = n - oldn;
        for (; i--; cp += elemsize)
        {
            t_word *wp = (t_word *)cp;
            word_init(wp, template, &x->a_gp);
        }
    }
    x->a_valid = ++glist_valid;
}